

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
ElementsTransactionApi_FundRawTransaction_MinBits36_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_MinBits36_Test *this)

{
  undefined1 *puVar1;
  void *pvVar2;
  pointer pTVar3;
  bool bVar4;
  uint32_t uVar5;
  pointer hex;
  ulong uVar6;
  char *pcVar7;
  pointer pCVar8;
  AssertionResult gtest_ar;
  ElementsTransactionApi api;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  ConfidentialTransactionContext context;
  string descMulti;
  UtxoFilter filter;
  ElementsAddressFactory factory;
  ElementsConfidentialAddress ct_addr1;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  ConfidentialAssetId fee_asset;
  ElementsConfidentialAddress reserve_ct_addr1;
  CoinSelectionOption option;
  ExtPubkey key;
  ElementsConfidentialAddress ct_addr2;
  Amount estimate_fee;
  ElementsConfidentialAddress reserve_ct_addr2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  ElementsConfidentialAddress ct_addr3;
  ConfidentialTransactionController ctx;
  ElementsConfidentialAddress ct_addr4;
  ConfidentialTransactionContext tx;
  Address addr2;
  Address addr1;
  Address set_addr4;
  Address set_addr3;
  Address set_addr2;
  Address set_addr1;
  Txid local_18c8;
  undefined1 local_18a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1898;
  ElementsTransactionApi local_1879;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1878;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1858;
  string local_1840;
  undefined1 local_1820 [40];
  pointer local_17f8;
  pointer local_17e8;
  pointer local_17e0;
  pointer local_17d0;
  pointer local_17c0;
  _Base_ptr local_17b0;
  _Base_ptr local_17a8;
  pointer local_1798;
  string local_1748;
  pointer local_1728;
  long *local_1720 [2];
  long local_1710 [2];
  UtxoFilter local_16fc;
  AddressFactory local_16f8;
  undefined1 local_16d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_16c0 [2];
  pointer local_1698;
  pointer local_1690;
  pointer local_1680;
  pointer local_1670;
  pointer local_1660;
  _func_int **local_1658;
  _func_int **local_1648;
  pointer local_1550;
  pointer local_1540;
  _Alloc_hider local_1538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1528;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  local_1518;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  local_14f8;
  Pubkey local_14e0;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  local_14c8;
  ConfidentialAssetId local_14b0;
  undefined1 local_1488 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1478 [2];
  pointer local_1450;
  pointer local_1448;
  pointer local_1438;
  pointer local_1428;
  pointer local_1418;
  _func_int **local_1410;
  _func_int **local_1400;
  pointer local_1308;
  pointer local_12f8;
  _Alloc_hider local_12f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12e0;
  Privkey local_12d0;
  CoinSelectionOption local_12b0;
  ExtPubkey local_1248;
  undefined1 local_11b8 [16];
  _Alloc_hider local_11a8;
  pointer local_11a0;
  undefined8 local_1190;
  pointer local_1180;
  pointer local_1178;
  pointer local_1168;
  pointer local_1158;
  pointer local_1148;
  _func_int **local_1140;
  _func_int **local_1130;
  pointer local_1038;
  pointer local_1028;
  _Alloc_hider local_1020;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1010;
  Amount local_1000;
  undefined1 local_ff0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fe0 [2];
  pointer local_fb8;
  pointer local_fb0;
  pointer local_fa0;
  pointer local_f90;
  pointer local_f80;
  _func_int **local_f78;
  _func_int **local_f68;
  pointer local_e70;
  pointer local_e60;
  _Alloc_hider local_e58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e48;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  local_e38;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e08;
  SigHashType local_dd4;
  undefined1 local_dc8 [16];
  _Alloc_hider local_db8;
  pointer local_db0;
  undefined8 local_da0;
  pointer local_d90;
  pointer local_d88;
  pointer local_d78;
  pointer local_d68;
  pointer local_d58;
  _func_int **local_d50;
  _func_int **local_d40;
  pointer local_c48;
  pointer local_c38;
  _Alloc_hider local_c30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c20;
  ConfidentialTransactionController local_c10;
  undefined1 local_bc0 [16];
  _Alloc_hider local_bb0;
  pointer local_ba8;
  undefined8 local_b98;
  pointer local_b88;
  pointer local_b80;
  pointer local_b70;
  pointer local_b60;
  pointer local_b50;
  _func_int **local_b48;
  _func_int **local_b38;
  pointer local_a40;
  pointer local_a30;
  _Alloc_hider local_a28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a18;
  ConfidentialTransactionContext local_a08;
  Address local_930;
  Address local_7b0;
  Address local_630;
  Address local_4b0;
  Address local_330;
  Address local_1b0;
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&local_a08,2,0);
  local_1878.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1878.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1878.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_16f8,kElementsRegtest);
  local_1720[0] = local_1710;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1720,
             "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))"
             ,"");
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            (&local_1878,
             ((long)kFundCoinSelectElementsTestVector2.
                    super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)kFundCoinSelectElementsTestVector2.
                    super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  pTVar3 = kFundCoinSelectElementsTestVector2.
           super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (kFundCoinSelectElementsTestVector2.
      super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      kFundCoinSelectElementsTestVector2.
      super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 0;
    hex = kFundCoinSelectElementsTestVector2.
          super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid((Txid *)local_11b8);
      if ((hex->txid)._M_string_length != 0) {
        cfd::core::Txid::Txid((Txid *)local_16d0,&hex->txid);
        cfd::core::Txid::operator=((Txid *)local_11b8,(Txid *)local_16d0);
        local_16d0._0_8_ = &PTR__Txid_0086d9f8;
        pvVar2 = (void *)CONCAT71(local_16d0._9_7_,local_16d0[8]);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,local_16c0[0]._8_8_ - (long)pvVar2);
        }
      }
      cfd::core::Txid::Txid((Txid *)local_16d0,&hex->txid);
      cfd::core::Txid::operator=
                (&local_1878.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar6].txid,(Txid *)local_16d0);
      local_16d0._0_8_ = &PTR__Txid_0086d9f8;
      pvVar2 = (void *)CONCAT71(local_16d0._9_7_,local_16d0[8]);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_16c0[0]._8_8_ - (long)pvVar2);
      }
      local_1878.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6].vout = hex->vout;
      cfd::core::Amount::Amount((Amount *)local_16d0,hex->amount);
      local_1878.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6].amount.ignore_check_ = (bool)local_16d0[8];
      local_1878.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6].amount.amount_ = local_16d0._0_8_;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_16d0,&hex->asset);
      cfd::core::ConfidentialAssetId::operator=
                (&local_1878.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar6].asset,
                 (ConfidentialAssetId *)local_16d0);
      local_16d0._0_8_ = &PTR__ConfidentialAssetId_0086dd08;
      pvVar2 = (void *)CONCAT71(local_16d0._9_7_,local_16d0[8]);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_16c0[0]._8_8_ - (long)pvVar2);
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 &local_1878.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar6].descriptor);
      local_1878.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6].address_type = kP2shP2wpkhAddress;
      local_11b8._0_8_ = &PTR__Txid_0086d9f8;
      if ((pointer)local_11b8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_11b8._8_8_,(long)local_11a0 - local_11b8._8_8_);
      }
      hex = hex + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (hex != pTVar3);
  }
  local_16d0._0_8_ = local_16c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16d0,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,"");
  cfd::core::ExtPubkey::ExtPubkey(&local_1248,(string *)local_16d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16d0._0_8_ != local_16c0) {
    operator_delete((void *)local_16d0._0_8_,(ulong)(local_16c0[0]._M_allocated_capacity + 1));
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_16d0,&local_1248,0xb);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_11b8,(Extkey *)local_16d0);
  cfd::AddressFactory::CreateP2wpkhAddress(&local_1b0,&local_16f8,(Pubkey *)local_11b8);
  if ((_func_int **)local_11b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_11b8._0_8_,(long)local_11a8._M_p - local_11b8._0_8_);
  }
  if (local_1658 != (_func_int **)0x0) {
    operator_delete(local_1658,(long)local_1648 - (long)local_1658);
  }
  if (local_1670 != (pointer)0x0) {
    operator_delete(local_1670,(long)local_1660 - (long)local_1670);
  }
  if (local_1690 != (pointer)0x0) {
    operator_delete(local_1690,(long)local_1680 - (long)local_1690);
  }
  if ((pointer)local_16c0[1]._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_16c0[1]._8_8_,(long)local_1698 - local_16c0[1]._8_8_);
  }
  pvVar2 = (void *)CONCAT71(local_16d0._9_7_,local_16d0[8]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_16c0[0]._8_8_ - (long)pvVar2);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_16d0,&local_1248,0xc);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_11b8,(Extkey *)local_16d0);
  cfd::AddressFactory::CreateP2wpkhAddress(&local_330,&local_16f8,(Pubkey *)local_11b8);
  if ((_func_int **)local_11b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_11b8._0_8_,(long)local_11a8._M_p - local_11b8._0_8_);
  }
  if (local_1658 != (_func_int **)0x0) {
    operator_delete(local_1658,(long)local_1648 - (long)local_1658);
  }
  if (local_1670 != (pointer)0x0) {
    operator_delete(local_1670,(long)local_1660 - (long)local_1670);
  }
  if (local_1690 != (pointer)0x0) {
    operator_delete(local_1690,(long)local_1680 - (long)local_1690);
  }
  if ((pointer)local_16c0[1]._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_16c0[1]._8_8_,(long)local_1698 - local_16c0[1]._8_8_);
  }
  pvVar2 = (void *)CONCAT71(local_16d0._9_7_,local_16d0[8]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_16c0[0]._8_8_ - (long)pvVar2);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_16d0,&local_1248,0xd);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_11b8,(Extkey *)local_16d0);
  cfd::AddressFactory::CreateP2wpkhAddress(&local_4b0,&local_16f8,(Pubkey *)local_11b8);
  if ((_func_int **)local_11b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_11b8._0_8_,(long)local_11a8._M_p - local_11b8._0_8_);
  }
  if (local_1658 != (_func_int **)0x0) {
    operator_delete(local_1658,(long)local_1648 - (long)local_1658);
  }
  if (local_1670 != (pointer)0x0) {
    operator_delete(local_1670,(long)local_1660 - (long)local_1670);
  }
  if (local_1690 != (pointer)0x0) {
    operator_delete(local_1690,(long)local_1680 - (long)local_1690);
  }
  if ((pointer)local_16c0[1]._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_16c0[1]._8_8_,(long)local_1698 - local_16c0[1]._8_8_);
  }
  pvVar2 = (void *)CONCAT71(local_16d0._9_7_,local_16d0[8]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_16c0[0]._8_8_ - (long)pvVar2);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_16d0,&local_1248,0xe);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_11b8,(Extkey *)local_16d0);
  cfd::AddressFactory::CreateP2wpkhAddress(&local_630,&local_16f8,(Pubkey *)local_11b8);
  if ((_func_int **)local_11b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_11b8._0_8_,(long)local_11a8._M_p - local_11b8._0_8_);
  }
  if (local_1658 != (_func_int **)0x0) {
    operator_delete(local_1658,(long)local_1648 - (long)local_1658);
  }
  if (local_1670 != (pointer)0x0) {
    operator_delete(local_1670,(long)local_1660 - (long)local_1670);
  }
  if (local_1690 != (pointer)0x0) {
    operator_delete(local_1690,(long)local_1680 - (long)local_1690);
  }
  if ((pointer)local_16c0[1]._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_16c0[1]._8_8_,(long)local_1698 - local_16c0[1]._8_8_);
  }
  pvVar2 = (void *)CONCAT71(local_16d0._9_7_,local_16d0[8]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_16c0[0]._8_8_ - (long)pvVar2);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_11b8,&local_1248,0x6f);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_dc8,(Extkey *)local_11b8);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_16d0,&local_1b0,(ConfidentialKey *)local_dc8);
  if ((pointer)local_dc8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_dc8._0_8_,(long)local_db8._M_p - local_dc8._0_8_);
  }
  if (local_1140 != (_func_int **)0x0) {
    operator_delete(local_1140,(long)local_1130 - (long)local_1140);
  }
  if (local_1158 != (pointer)0x0) {
    operator_delete(local_1158,(long)local_1148 - (long)local_1158);
  }
  if (local_1178 != (pointer)0x0) {
    operator_delete(local_1178,(long)local_1168 - (long)local_1178);
  }
  if ((pointer)local_1190 != (pointer)0x0) {
    operator_delete((void *)local_1190,(long)local_1180 - local_1190);
  }
  if ((pointer)local_11b8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_11b8._8_8_,(long)local_11a0 - local_11b8._8_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_dc8,&local_1248,0x70);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_bc0,(Extkey *)local_dc8);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_11b8,&local_330,(ConfidentialKey *)local_bc0);
  if ((pointer)local_bc0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_bc0._0_8_,(long)local_bb0._M_p - local_bc0._0_8_);
  }
  if (local_d50 != (_func_int **)0x0) {
    operator_delete(local_d50,(long)local_d40 - (long)local_d50);
  }
  if (local_d68 != (pointer)0x0) {
    operator_delete(local_d68,(long)local_d58 - (long)local_d68);
  }
  if (local_d88 != (pointer)0x0) {
    operator_delete(local_d88,(long)local_d78 - (long)local_d88);
  }
  if ((pointer)local_da0 != (pointer)0x0) {
    operator_delete((void *)local_da0,(long)local_d90 - local_da0);
  }
  if ((pointer)local_dc8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_dc8._8_8_,(long)local_db0 - local_dc8._8_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_bc0,&local_1248,0x71);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_1488,(Extkey *)local_bc0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_dc8,&local_4b0,(ConfidentialKey *)local_1488);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1488._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_1488._0_8_,local_1478[0]._M_allocated_capacity - local_1488._0_8_)
    ;
  }
  if (local_b48 != (_func_int **)0x0) {
    operator_delete(local_b48,(long)local_b38 - (long)local_b48);
  }
  if (local_b60 != (pointer)0x0) {
    operator_delete(local_b60,(long)local_b50 - (long)local_b60);
  }
  if (local_b80 != (pointer)0x0) {
    operator_delete(local_b80,(long)local_b70 - (long)local_b80);
  }
  if ((pointer)local_b98 != (pointer)0x0) {
    operator_delete((void *)local_b98,(long)local_b88 - local_b98);
  }
  if ((pointer)local_bc0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_bc0._8_8_,(long)local_ba8 - local_bc0._8_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_1488,&local_1248,0x72);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_ff0,(Extkey *)local_1488);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_bc0,&local_630,(ConfidentialKey *)local_ff0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_ff0._0_8_,local_fe0[0]._M_allocated_capacity - local_ff0._0_8_);
  }
  if (local_1410 != (_func_int **)0x0) {
    operator_delete(local_1410,(long)local_1400 - (long)local_1410);
  }
  if (local_1428 != (pointer)0x0) {
    operator_delete(local_1428,(long)local_1418 - (long)local_1428);
  }
  if (local_1448 != (pointer)0x0) {
    operator_delete(local_1448,(long)local_1438 - (long)local_1448);
  }
  if ((pointer)local_1478[1]._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1478[1]._8_8_,(long)local_1450 - local_1478[1]._8_8_);
  }
  if ((pointer)local_1488._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1488._8_8_,local_1478[0]._8_8_ - local_1488._8_8_);
  }
  cfd::core::Amount::Amount((Amount *)local_1488,300000000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_a08,(ElementsConfidentialAddress *)local_16d0,(Amount *)local_1488,
             &exp_dummy_asset_a,false);
  cfd::core::Amount::Amount((Amount *)local_1488,50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_a08,(ElementsConfidentialAddress *)local_11b8,(Amount *)local_1488,
             &exp_dummy_asset_b,false);
  cfd::core::Amount::Amount((Amount *)local_1488,50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_a08,(ElementsConfidentialAddress *)local_dc8,(Amount *)local_1488,
             &exp_dummy_asset_a,false);
  cfd::core::Amount::Amount((Amount *)local_1488,50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_a08,(ElementsConfidentialAddress *)local_bc0,(Amount *)local_1488,
             &exp_dummy_asset_a,false);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_14b0,&exp_dummy_asset_a);
  local_e38._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e38._M_impl.super__Rb_tree_header._M_header;
  local_e38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e38._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e38._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e38._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_1488,&exp_dummy_asset_a);
  cfd::core::Amount::Amount((Amount *)local_ff0,0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_e38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1488,
             (Amount *)local_ff0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1488._0_8_ != local_1478) {
    operator_delete((void *)local_1488._0_8_,(ulong)(local_1478[0]._M_allocated_capacity + 1));
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_1488,&exp_dummy_asset_b);
  cfd::core::Amount::Amount((Amount *)local_ff0,0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_e38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1488,
             (Amount *)local_ff0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1488._0_8_ != local_1478) {
    operator_delete((void *)local_1488._0_8_,(ulong)(local_1478[0]._M_allocated_capacity + 1));
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_1488,&local_1248,1);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_ff0,(Extkey *)local_1488);
  cfd::AddressFactory::CreateP2wpkhAddress(&local_7b0,&local_16f8,(Pubkey *)local_ff0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_ff0._0_8_,local_fe0[0]._M_allocated_capacity - local_ff0._0_8_);
  }
  if (local_1410 != (_func_int **)0x0) {
    operator_delete(local_1410,(long)local_1400 - (long)local_1410);
  }
  if (local_1428 != (pointer)0x0) {
    operator_delete(local_1428,(long)local_1418 - (long)local_1428);
  }
  if (local_1448 != (pointer)0x0) {
    operator_delete(local_1448,(long)local_1438 - (long)local_1448);
  }
  if ((pointer)local_1478[1]._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1478[1]._8_8_,(long)local_1450 - local_1478[1]._8_8_);
  }
  if ((pointer)local_1488._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1488._8_8_,local_1478[0]._8_8_ - local_1488._8_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_1488,&local_1248,2);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_ff0,(Extkey *)local_1488);
  cfd::AddressFactory::CreateP2wpkhAddress(&local_930,&local_16f8,(Pubkey *)local_ff0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_ff0._0_8_,local_fe0[0]._M_allocated_capacity - local_ff0._0_8_);
  }
  if (local_1410 != (_func_int **)0x0) {
    operator_delete(local_1410,(long)local_1400 - (long)local_1410);
  }
  if (local_1428 != (pointer)0x0) {
    operator_delete(local_1428,(long)local_1418 - (long)local_1428);
  }
  if (local_1448 != (pointer)0x0) {
    operator_delete(local_1448,(long)local_1438 - (long)local_1448);
  }
  if ((pointer)local_1478[1]._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1478[1]._8_8_,(long)local_1450 - local_1478[1]._8_8_);
  }
  if ((pointer)local_1488._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1488._8_8_,local_1478[0]._8_8_ - local_1488._8_8_);
  }
  local_e08._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e08._M_impl.super__Rb_tree_header._M_header;
  local_e08._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e08._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e08._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e08._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e08._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_1488,&exp_dummy_asset_a);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_ff0,&local_7b0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_e08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1488,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ff0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._0_8_ != local_fe0) {
    operator_delete((void *)local_ff0._0_8_,(ulong)(local_fe0[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1488._0_8_ != local_1478) {
    operator_delete((void *)local_1488._0_8_,(ulong)(local_1478[0]._M_allocated_capacity + 1));
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_1488,&exp_dummy_asset_b);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_ff0,&local_930);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_e08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1488,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ff0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._0_8_ != local_fe0) {
    operator_delete((void *)local_ff0._0_8_,(ulong)(local_fe0[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1488._0_8_ != local_1478) {
    operator_delete((void *)local_1488._0_8_,(ulong)(local_1478[0]._M_allocated_capacity + 1));
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_ff0,&local_1248,0x5b);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_1820,(Extkey *)local_ff0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1488,&local_7b0,(ConfidentialKey *)local_1820);
  pvVar2 = (void *)CONCAT71(local_1820._1_7_,local_1820[0]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_1820._16_8_ - (long)pvVar2);
  }
  if (local_f78 != (_func_int **)0x0) {
    operator_delete(local_f78,(long)local_f68 - (long)local_f78);
  }
  if (local_f90 != (pointer)0x0) {
    operator_delete(local_f90,(long)local_f80 - (long)local_f90);
  }
  if (local_fb0 != (pointer)0x0) {
    operator_delete(local_fb0,(long)local_fa0 - (long)local_fb0);
  }
  if ((pointer)local_fe0[1]._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_fe0[1]._8_8_,(long)local_fb8 - local_fe0[1]._8_8_);
  }
  if ((pointer)local_ff0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_ff0._8_8_,local_fe0[0]._8_8_ - local_ff0._8_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_1820,&local_1248,0x5c);
  cfd::core::Extkey::GetPubkey((Pubkey *)&local_12b0,(Extkey *)local_1820);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_ff0,&local_930,(ConfidentialKey *)&local_12b0);
  if ((void *)local_12b0._0_8_ != (void *)0x0) {
    operator_delete((void *)local_12b0._0_8_,local_12b0.effective_fee_baserate_ - local_12b0._0_8_);
  }
  if (local_17a8 != (_Base_ptr)0x0) {
    operator_delete(local_17a8,(long)local_1798 - (long)local_17a8);
  }
  if (local_17c0 != (pointer)0x0) {
    operator_delete(local_17c0,(long)local_17b0 - (long)local_17c0);
  }
  if (local_17e0 != (pointer)0x0) {
    operator_delete(local_17e0,(long)local_17d0 - (long)local_17e0);
  }
  if (local_17f8 != (pointer)0x0) {
    operator_delete(local_17f8,(long)local_17e8 - (long)local_17f8);
  }
  if ((pointer)local_1820._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1820._8_8_,local_1820._24_8_ - local_1820._8_8_);
  }
  local_14f8.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_14f8.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14f8.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(&local_1000);
  local_1858.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1858.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1858.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&local_12b0);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&local_12b0);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&local_12b0,0.1);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(&local_12b0,0.1);
  cfd::CoinSelectionOption::SetFeeAsset(&local_12b0,&local_14b0);
  cfd::CoinSelectionOption::SetBlindInfo(&local_12b0,0,0x24);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_1820,(AbstractTransaction *)&local_a08);
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (&local_c10,&local_1879,(string *)local_1820,&local_1878,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
              *)&local_e38,&local_14f8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_e08,&local_14b0,true,0.1,&local_1000,&local_16fc,&local_12b0,&local_1858,
             kCfdInvalidSettingError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  puVar1 = local_1820 + 0x10;
  if ((undefined1 *)CONCAT71(local_1820._1_7_,local_1820[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_1820._1_7_,local_1820[0]),
                    (ulong)(local_1820._16_8_ + 1));
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_1820,&local_c10.super_AbstractTransactionController);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_18a8,"kExpTxData","ctx.GetHex().c_str()",
             "0200000000040a503dbd4f8f2b064c70e048b21f93fe4584174478abf5f44747932cd21da87c0000000000ffffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000ffffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000ffffffff020b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff070100000000000000000000000000000000000000000000000000000000000000aa01000110d9316ec00003b86ca86f23bc47e6ae1eebf2dea191f0ab98b89e2d5b6e5e8de20631441caeaa1600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb010000000ba43b740003a9dda6bdef90309c4fb5fe9131e396e9f9b32dc1b8defea451f71e6af1127b1d1600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b740003fef01583b95b37ee4f23d3673dfcc01faa4654272c289e8e3caa6aeb31f634741600144852255c0ff013e835689f30fb52508f89b6fbe20100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b7400037703a4ef463f044f462f35c4dece9d1f02d32681079c2c01cea4d6267dd782ef1600143159e9a1f6cdd588b6d5df65c3c7a190ecf0fba70100000000000000000000000000000000000000000000000000000000000000aa01000000000000026400000100000000000000000000000000000000000000000000000000000000000000bb01000000a2fb40580000160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa01000000fd340d189c0016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000"
             ,(char *)CONCAT71(local_1820._1_7_,local_1820[0]));
  if ((undefined1 *)CONCAT71(local_1820._1_7_,local_1820[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_1820._1_7_,local_1820[0]),
                    (ulong)(local_1820._16_8_ + 1));
  }
  if (local_18a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1820);
    if ((pointer)local_18a8._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_18a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_18c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x326,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_18c8,(Message *)local_1820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18c8);
    if (CONCAT71(local_1820._1_7_,local_1820[0]) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT71(local_1820._1_7_,local_1820[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_1820._1_7_,local_1820[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_18a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_18c8._vptr_Txid = (_func_int **)CONCAT44(local_18c8._vptr_Txid._4_4_,0x264);
  local_18a8._0_8_ = cfd::core::Amount::GetSatoshiValue(&local_1000);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_1820,"612","estimate_fee.GetSatoshiValue()",(int *)&local_18c8,
             (long *)local_18a8);
  if (local_1820[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_18a8);
    if ((pointer)local_1820._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_1820._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_18c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x327,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_18c8,(Message *)local_18a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18a8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_18a8._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1820 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_18a8._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_18c8._vptr_Txid =
       (_func_int **)
       ((long)local_1858.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_1858.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1820,"size_t{2}","append_txout_addresses.size()",
             (unsigned_long *)local_18a8,(unsigned_long *)&local_18c8);
  if (local_1820[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_18a8);
    if ((pointer)local_1820._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_1820._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_18c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x328,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_18c8,(Message *)local_18a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18a8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_18a8._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_18a8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1820 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if ((long)local_1858.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_1858.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x40) {
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_1820,&local_7b0);
    testing::internal::CmpHelperSTREQ
              ((internal *)local_18a8,"addr1.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",(char *)CONCAT71(local_1820._1_7_,local_1820[0]),
               local_1858.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    if ((undefined1 *)CONCAT71(local_1820._1_7_,local_1820[0]) != puVar1) {
      operator_delete((undefined1 *)CONCAT71(local_1820._1_7_,local_1820[0]),
                      (ulong)(local_1820._16_8_ + 1));
    }
    if (local_18a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1820);
      if ((pointer)local_18a8._8_8_ == (pointer)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_18a8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_18c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x32b,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_18c8,(Message *)local_1820);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18c8);
      if (CONCAT71(local_1820._1_7_,local_1820[0]) != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((long *)CONCAT71(local_1820._1_7_,local_1820[0]) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_1820._1_7_,local_1820[0]) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_18a8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_1820,&local_930);
    testing::internal::CmpHelperSTREQ
              ((internal *)local_18a8,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",(char *)CONCAT71(local_1820._1_7_,local_1820[0]),
               ((local_1858.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    if ((undefined1 *)CONCAT71(local_1820._1_7_,local_1820[0]) != puVar1) {
      operator_delete((undefined1 *)CONCAT71(local_1820._1_7_,local_1820[0]),
                      (ulong)(local_1820._16_8_ + 1));
    }
    if (local_18a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1820);
      if ((pointer)local_18a8._8_8_ == (pointer)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_18a8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_18c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x32c,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_18c8,(Message *)local_1820);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18c8);
      if (CONCAT71(local_1820._1_7_,local_1820[0]) != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((long *)CONCAT71(local_1820._1_7_,local_1820[0]) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_1820._1_7_,local_1820[0]) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_18a8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_18a8,&local_c10.super_AbstractTransactionController);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1820,(string *)local_18a8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18a8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_18a8 + 0x10)
     ) {
    operator_delete((void *)local_18a8._0_8_,local_1898._M_allocated_capacity + 1);
  }
  local_1518.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1518.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1518.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1518,(value_type *)local_1488);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1518,(value_type *)local_ff0);
  cfd::ConfidentialTransactionContext::CollectInputUtxo
            ((ConfidentialTransactionContext *)local_1820,&local_1878);
  cfd::ConfidentialTransactionContext::Blind
            ((ConfidentialTransactionContext *)local_1820,&local_1518,1,0,0x24,
             (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
  cfd::core::ConfidentialTransaction::GetTxInList(&local_14c8,(ConfidentialTransaction *)local_1820)
  ;
  local_1728 = local_14c8.
               super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  if (local_14c8.
      super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_14c8.
      super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pCVar8 = local_14c8.
             super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid(&local_18c8,&(pCVar8->super_AbstractTxInReference).txid_);
      cfd::core::OutPoint::OutPoint
                ((OutPoint *)local_18a8,&local_18c8,(pCVar8->super_AbstractTxInReference).vout_);
      local_1840._M_dataplus._M_p = (pointer)&local_1840.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1840,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_14e0,&local_1840);
      local_1748._M_dataplus._M_p = (pointer)&local_1748.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1748,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_12d0,&local_1748,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_dd4);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_1820,(OutPoint *)local_18a8,&local_14e0,
                 &local_12d0,&local_dd4,true,(ByteData256 *)0x0,(ByteData *)0x0);
      if (local_12d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_12d0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_12d0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_12d0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1748._M_dataplus._M_p != &local_1748.field_2) {
        operator_delete(local_1748._M_dataplus._M_p,local_1748.field_2._M_allocated_capacity + 1);
      }
      if (local_14e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_14e0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_14e0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_14e0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1840._M_dataplus._M_p != &local_1840.field_2) {
        operator_delete(local_1840._M_dataplus._M_p,local_1840.field_2._M_allocated_capacity + 1);
      }
      local_18a8._0_8_ = &PTR__Txid_0086d9f8;
      if ((pointer)local_18a8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_18a8._8_8_,local_1898._8_8_ - local_18a8._8_8_);
      }
      local_18c8._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
      if (local_18c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_18c8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_18c8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_18c8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pCVar8 = pCVar8 + 1;
    } while (pCVar8 != local_1728);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector(&local_14c8);
  uVar5 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1820);
  if (uVar5 != 0x17e6) {
    uVar5 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1820);
    if (uVar5 != 0x17e7) {
      uVar5 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1820);
      if (uVar5 != 0x17e8) {
        local_18c8._vptr_Txid = (_func_int **)CONCAT44(local_18c8._vptr_Txid._4_4_,100);
        uVar5 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1820);
        local_1840._M_dataplus._M_p._0_4_ = uVar5;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)local_18a8,"100","context.GetVsize()",(int *)&local_18c8,
                   (uint *)&local_1840);
        if (local_18a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_18c8);
          if ((pointer)local_18a8._8_8_ == (pointer)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)local_18a8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1840,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                     ,0x33c,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1840,(Message *)&local_18c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1840);
          if (local_18c8._vptr_Txid != (_func_int **)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (local_18c8._vptr_Txid != (_func_int **)0x0)) {
              (**(code **)(*local_18c8._vptr_Txid + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_18a8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&local_1518);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1820);
  local_c10.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_0086d980;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_c10.transaction_);
  local_12b0.fee_asset_._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0086dd08
  ;
  if (local_12b0.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_12b0.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_12b0.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_12b0.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1858);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&local_14f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e58._M_p != &local_e48) {
    operator_delete(local_e58._M_p,local_e48._M_allocated_capacity + 1);
  }
  if (local_e70 != (pointer)0x0) {
    operator_delete(local_e70,(long)local_e60 - (long)local_e70);
  }
  cfd::core::Address::~Address((Address *)local_ff0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f0._M_p != &local_12e0) {
    operator_delete(local_12f0._M_p,local_12e0._M_allocated_capacity + 1);
  }
  if (local_1308 != (pointer)0x0) {
    operator_delete(local_1308,(long)local_12f8 - (long)local_1308);
  }
  cfd::core::Address::~Address((Address *)local_1488);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e08);
  cfd::core::Address::~Address(&local_930);
  cfd::core::Address::~Address(&local_7b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&local_e38);
  local_14b0._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0086dd08;
  if (local_14b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_14b0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_14b0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_14b0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a28._M_p != &local_a18) {
    operator_delete(local_a28._M_p,local_a18._M_allocated_capacity + 1);
  }
  if (local_a40 != (pointer)0x0) {
    operator_delete(local_a40,(long)local_a30 - (long)local_a40);
  }
  cfd::core::Address::~Address((Address *)local_bc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_p != &local_c20) {
    operator_delete(local_c30._M_p,local_c20._M_allocated_capacity + 1);
  }
  if (local_c48 != (pointer)0x0) {
    operator_delete(local_c48,(long)local_c38 - (long)local_c48);
  }
  cfd::core::Address::~Address((Address *)local_dc8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1020._M_p != &local_1010) {
    operator_delete(local_1020._M_p,local_1010._M_allocated_capacity + 1);
  }
  if (local_1038 != (pointer)0x0) {
    operator_delete(local_1038,(long)local_1028 - (long)local_1038);
  }
  cfd::core::Address::~Address((Address *)local_11b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1538._M_p != &local_1528) {
    operator_delete(local_1538._M_p,local_1528._M_allocated_capacity + 1);
  }
  if (local_1550 != (pointer)0x0) {
    operator_delete(local_1550,(long)local_1540 - (long)local_1550);
  }
  cfd::core::Address::~Address((Address *)local_16d0);
  cfd::core::Address::~Address(&local_630);
  cfd::core::Address::~Address(&local_4b0);
  cfd::core::Address::~Address(&local_330);
  cfd::core::Address::~Address(&local_1b0);
  if (local_1248.super_Extkey.tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1248.super_Extkey.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1248.super_Extkey.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1248.super_Extkey.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1248.super_Extkey.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1248.super_Extkey.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1248.super_Extkey.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1248.super_Extkey.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1248.super_Extkey.privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1248.super_Extkey.privkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1248.super_Extkey.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1248.super_Extkey.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1248.super_Extkey.chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1248.super_Extkey.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1248.super_Extkey.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1248.super_Extkey.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1248.super_Extkey.fingerprint_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1248.super_Extkey.fingerprint_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1248.super_Extkey.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1248.super_Extkey.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] + 1);
  }
  local_16f8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_0086bad8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_16f8.prefix_list_);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_1878);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_a08);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_MinBits36) {
  static const char* const kExpTxData = "0200000000040a503dbd4f8f2b064c70e048b21f93fe4584174478abf5f44747932cd21da87c0000000000ffffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000ffffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000ffffffff020b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff070100000000000000000000000000000000000000000000000000000000000000aa01000110d9316ec00003b86ca86f23bc47e6ae1eebf2dea191f0ab98b89e2d5b6e5e8de20631441caeaa1600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb010000000ba43b740003a9dda6bdef90309c4fb5fe9131e396e9f9b32dc1b8defea451f71e6af1127b1d1600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b740003fef01583b95b37ee4f23d3673dfcc01faa4654272c289e8e3caa6aeb31f634741600144852255c0ff013e835689f30fb52508f89b6fbe20100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b7400037703a4ef463f044f462f35c4dece9d1f02d32681079c2c01cea4d6267dd782ef1600143159e9a1f6cdd588b6d5df65c3c7a190ecf0fba70100000000000000000000000000000000000000000000000000000000000000aa01000000000000026400000100000000000000000000000000000000000000000000000000000000000000bb01000000a2fb40580000160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa01000000fd340d189c0016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000";

  ConfidentialTransactionContext tx(uint32_t{2}, uint32_t{0});
  std::vector<UtxoData> utxos;
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  std::string descMulti = "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))";

  try {
    utxos.resize(kFundCoinSelectElementsTestVector2.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector2) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      utxos[i].address_type = AddressType::kP2shP2wpkhAddress;
      ++i;
    }

    // add txout
    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    Address set_addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(11).GetPubkey());
    Address set_addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(12).GetPubkey());
    Address set_addr3 = factory.CreateP2wpkhAddress(key.DerivePubkey(13).GetPubkey());
    Address set_addr4 = factory.CreateP2wpkhAddress(key.DerivePubkey(14).GetPubkey());
    ElementsConfidentialAddress ct_addr1 = ElementsConfidentialAddress(
        set_addr1, key.DerivePubkey(111).GetPubkey());
    ElementsConfidentialAddress ct_addr2 = ElementsConfidentialAddress(
        set_addr2, key.DerivePubkey(112).GetPubkey());
    ElementsConfidentialAddress ct_addr3 = ElementsConfidentialAddress(
        set_addr3, key.DerivePubkey(113).GetPubkey());
    ElementsConfidentialAddress ct_addr4 = ElementsConfidentialAddress(
        set_addr4, key.DerivePubkey(114).GetPubkey());
    tx.AddTxOut(ct_addr1, Amount(int64_t{300000000000000}), exp_dummy_asset_a);
    tx.AddTxOut(ct_addr2, Amount(int64_t{50000000000}), exp_dummy_asset_b);
    tx.AddTxOut(ct_addr3, Amount(int64_t{50000000000}), exp_dummy_asset_a);
    tx.AddTxOut(ct_addr4, Amount(int64_t{50000000000}), exp_dummy_asset_a);

    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{0}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{0}));
    Address addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(1).GetPubkey());
    Address addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(2).GetPubkey());
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
        addr1, key.DerivePubkey(91).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
        addr2, key.DerivePubkey(92).GetPubkey());
    std::vector<ElementsUtxoAndOption> selected_txin_utxos;
    double fee_rate = 0.1;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(fee_rate);
    option.SetFeeAsset(fee_asset);
    option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);

    EXPECT_STREQ(kExpTxData, ctx.GetHex().c_str());
    EXPECT_EQ(612, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{2}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{2})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[1].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
    }

    ConfidentialTransactionContext context(ctx.GetHex());
    std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
    ct_addrs.push_back(reserve_ct_addr1);
    ct_addrs.push_back(reserve_ct_addr2);
    context.CollectInputUtxo(utxos);
    context.Blind(&ct_addrs, 1, 0, 36);
    for (const auto& txin : context.GetTxInList()) {
      context.SignWithKey(OutPoint(txin.GetTxid(), txin.GetVout()),
          Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
          Privkey::FromWif(
              "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet));
    }
    if ((context.GetVsize() != 6118) && (context.GetVsize() != 6119) && (context.GetVsize() != 6120)) {
      EXPECT_EQ(100, context.GetVsize());
    }
    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}